

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRMatrixUtil.cpp
# Opt level: O2

void ZXing::QRCode::EmbedPositionDetectionPattern(int xStart,int yStart,TritMatrix *matrix)

{
  uint uVar1;
  pointer pTVar2;
  int i;
  int iVar3;
  long lVar4;
  int x;
  uint uVar5;
  long lVar6;
  uint uVar7;
  anon_class_8_1_60b188ff setIfInside;
  
  iVar3 = matrix->_width;
  pTVar2 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
           super__Vector_impl_data._M_start + (long)yStart * (long)iVar3 + (long)xStart;
  for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
    uVar5 = (int)lVar4 - 3;
    uVar1 = -uVar5;
    if (0 < (int)uVar5) {
      uVar1 = uVar5;
    }
    for (lVar6 = 0; lVar6 != 7; lVar6 = lVar6 + 1) {
      uVar7 = (int)lVar6 - 3;
      uVar5 = -uVar7;
      if (0 < (int)uVar7) {
        uVar5 = uVar7;
      }
      if (uVar5 <= uVar1) {
        uVar5 = uVar1;
      }
      pTVar2[lVar6].value = uVar5 != 2;
    }
    pTVar2 = pTVar2 + iVar3;
  }
  setIfInside.matrix = matrix;
  for (iVar3 = -1; iVar3 != 8; iVar3 = iVar3 + 1) {
    EmbedPositionDetectionPattern::anon_class_8_1_60b188ff::operator()
              (&setIfInside,xStart + iVar3,yStart + -1);
    EmbedPositionDetectionPattern::anon_class_8_1_60b188ff::operator()
              (&setIfInside,xStart + iVar3,yStart + 7);
    EmbedPositionDetectionPattern::anon_class_8_1_60b188ff::operator()
              (&setIfInside,xStart + -1,yStart + iVar3);
    EmbedPositionDetectionPattern::anon_class_8_1_60b188ff::operator()
              (&setIfInside,xStart + 7,yStart + iVar3);
  }
  return;
}

Assistant:

static void EmbedPositionDetectionPattern(int xStart, int yStart, TritMatrix& matrix)
{
	for (int y = 0; y < 7; ++y)
		for (int x = 0; x < 7; ++x)
			matrix.set(xStart + x, yStart + y, maxAbsComponent(PointI(x, y) - PointI(3, 3)) != 2);

	// Surround the 7x7 pattern with one line of white space (separation pattern)
	auto setIfInside = [&](int x, int y) {
		if( x >= 0 && x < matrix.width() && y >= 0 && y < matrix.height())
			matrix.set(x, y, 0);
	};

	for (int i = -1; i < 8; ++i) {
		setIfInside(xStart + i, yStart - 1); // top
		setIfInside(xStart + i, yStart + 7); // bottom
		setIfInside(xStart - 1, yStart + i); // left
		setIfInside(xStart + 7, yStart + i); // right
	}
}